

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool container_contains_range
                (container_t *c,uint32_t range_start,uint32_t range_end,uint8_t typecode)

{
  ushort uVar1;
  ushort uVar2;
  uint64_t *array;
  rle16_t *array_00;
  _Bool _Var3;
  int32_t iVar4;
  uint uVar5;
  undefined7 in_register_00000009;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  
  uVar5 = (uint)CONCAT71(in_register_00000009,typecode);
  if (uVar5 == 4) {
    uVar5 = (uint)*(byte *)((long)c + 8);
    c = *c;
  }
  if ((char)uVar5 == '\x03') {
    array_00 = (rle16_t *)((bitset_container_t *)c)->words;
    iVar4 = ((bitset_container_t *)c)->cardinality;
    uVar5 = interleavedBinarySearch(array_00,iVar4,(uint16_t)range_start);
    uVar6 = (ulong)uVar5;
    if ((-1 < (int)uVar5) ||
       ((uVar5 != 0xffffffff &&
        (uVar6 = (ulong)(-uVar5 - 2),
        range_start - array_00[uVar6].value <= (uint)array_00[uVar6].length)))) {
      uVar5 = 0;
      do {
        if ((long)iVar4 <= (long)uVar6) {
LAB_0011c271:
          return ~range_start + range_end <= uVar5;
        }
        uVar1 = array_00[uVar6].value;
        if (range_end <= uVar1) goto LAB_0011c271;
        uVar2 = array_00[uVar6].length;
        if (range_end <= (uint)uVar2 + (uint)uVar1) {
          uVar5 = (uVar5 + range_end) - (uint)uVar1;
          goto LAB_0011c271;
        }
        uVar7 = ((uint)uVar2 + (uint)uVar1) - range_start;
        if (uVar2 <= uVar7) {
          uVar7 = (uint)uVar2;
        }
        uVar5 = uVar5 + uVar7;
        uVar6 = uVar6 + 1;
      } while( true );
    }
  }
  else {
    if ((uVar5 & 0xff) != 2) {
      _Var3 = bitset_container_get_range((bitset_container_t *)c,range_start,range_end);
      return _Var3;
    }
    iVar8 = range_end - range_start;
    if (iVar8 == 0 || (int)range_end < (int)range_start) {
      return true;
    }
    uVar5 = ((bitset_container_t *)c)->cardinality;
    if (iVar8 <= (int)uVar5) {
      array = ((bitset_container_t *)c)->words;
      iVar4 = binarySearch((uint16_t *)array,uVar5,(uint16_t)range_start);
      if ((-1 < iVar4) && ((uint)(iVar4 + iVar8) <= uVar5)) {
        return *(short *)((long)array + (ulong)(uint)(iVar4 + iVar8) * 2 + -2) ==
               (short)((short)range_end + -1);
      }
    }
  }
  return false;
}

Assistant:

static inline bool container_contains_range(
    const container_t *c, uint32_t range_start, uint32_t range_end,
    uint8_t typecode  // !!! should be second argument?
) {
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_get_range(const_CAST_bitset(c), range_start,
                                              range_end);
        case ARRAY_CONTAINER_TYPE:
            return array_container_contains_range(const_CAST_array(c),
                                                  range_start, range_end);
        case RUN_CONTAINER_TYPE:
            return run_container_contains_range(const_CAST_run(c), range_start,
                                                range_end);
        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}